

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void prepare_half_coeffs_8tap_avx2
               (InterpFilterParams *filter_params,int32_t subpel_q4,__m256i *coeffs)

{
  __m128i coeffs_128;
  undefined1 (*pauVar1) [16];
  uint in_ESI;
  InterpFilterParams *in_RDI;
  __m128i coeffs_1;
  __m128i coeffs_8;
  int16_t *filter;
  undefined4 in_stack_ffffffffffffffc8;
  
  pauVar1 = (undefined1 (*) [16])av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  vpsraw_avx(*pauVar1,ZEXT416(1));
  coeffs_128[1] = (longlong)pauVar1;
  coeffs_128[0] = (longlong)in_RDI;
  populate_coeffs_8tap_avx2(coeffs_128,(__m256i *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

static inline void prepare_half_coeffs_8tap_avx2(
    const InterpFilterParams *const filter_params, const int32_t subpel_q4,
    __m256i *const coeffs /* [4] */) {
  const int16_t *const filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);
  const __m128i coeffs_8 = _mm_loadu_si128((__m128i *)filter);

  // right shift all filter co-efficients by 1 to reduce the bits required.
  // This extra right shift will be taken care of at the end while rounding
  // the result.
  // Since all filter co-efficients are even, this change will not affect the
  // end result
  assert(_mm_test_all_zeros(_mm_and_si128(coeffs_8, _mm_set1_epi16(1)),
                            _mm_set1_epi16((short)0xffff)));
  const __m128i coeffs_1 = _mm_srai_epi16(coeffs_8, 1);
  populate_coeffs_8tap_avx2(coeffs_1, coeffs);
}